

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lockstep_scheduler_test.cpp
# Opt level: O0

int random_number(int min,int max)

{
  result_type rVar1;
  int random_number;
  uniform_int_distribution<int> distribution;
  default_random_engine engine;
  seed_seq seed;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  uniform_int_distribution<int> *this;
  int local_34;
  int *local_30;
  undefined8 local_28;
  uniform_int_distribution<int> in_stack_ffffffffffffffe0;
  initializer_list<int> in_stack_ffffffffffffffe8;
  
  local_34 = ::random_number::iteration;
  local_30 = &local_34;
  local_28 = 1;
  this = (uniform_int_distribution<int> *)&stack0xffffffffffffffe0;
  ::random_number::iteration = ::random_number::iteration + 1;
  std::seed_seq::seed_seq<int,void>
            ((seed_seq *)in_stack_ffffffffffffffe0._M_param,in_stack_ffffffffffffffe8);
  std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>::
  linear_congruential_engine<std::seed_seq,void>
            ((linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)this,
             (seed_seq *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  std::uniform_int_distribution<int>::uniform_int_distribution
            (this,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
  rVar1 = std::uniform_int_distribution<int>::operator()
                    (this,(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                          CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  std::seed_seq::~seed_seq((seed_seq *)0x10f89f);
  return rVar1;
}

Assistant:

int random_number(int min, int max)
{
    // We want predictable test results, so we always
    // start with the seed 0.
    static int iteration = 0;

    std::seed_seq seed{iteration++};
    std::default_random_engine engine{seed};
    std::uniform_int_distribution<> distribution(min, max);

    const int random_number = distribution(engine);
    return random_number;
}